

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O0

void (anonymous_namespace)::test_color<color<unsigned_char,1u>>
               (color<unsigned_char,_1U> input,color<unsigned_char,_1U> output)

{
  bool bVar1;
  uint32_t uVar2;
  Type TVar3;
  uchar *puVar4;
  AssertionResult gtest_ar_1;
  uint32_t i_2;
  AssertionResult gtest_ar;
  uint32_t i_1;
  uint32_t i;
  color<unsigned_char,_1U> color;
  AssertHelper *in_stack_ffffffffffffff50;
  uchar *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar5;
  char *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  Type type;
  uint in_stack_ffffffffffffff80;
  uint uVar6;
  AssertionResult local_60;
  uint local_4c;
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_20;
  Type local_c;
  uint local_8;
  color<unsigned_char,_1U> local_3;
  color<unsigned_char,_1U> local_2;
  color<unsigned_char,_1U> local_1;
  
  color<unsigned_char,_1U>::color(&local_3);
  local_8 = 0;
  while (uVar6 = local_8, uVar2 = color<unsigned_char,_1U>::comps_count(&local_3), uVar6 < uVar2) {
    in_stack_ffffffffffffff80 = local_8;
    puVar4 = color<unsigned_char,_1U>::operator[](&local_1,local_8);
    color<unsigned_char,_1U>::set(&local_3,in_stack_ffffffffffffff80,*puVar4);
    local_8 = local_8 + 1;
  }
  local_c = kSuccess;
  while (type = local_c, TVar3 = color<unsigned_char,_1U>::comps_count(&local_3), type < TVar3) {
    in_stack_ffffffffffffff70 = color<unsigned_char,_1U>::operator[](&local_3,local_c);
    color<unsigned_char,_1U>::operator[](&local_1,local_c);
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
              (in_stack_ffffffffffffff68,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58,(uchar *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar6,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff68 =
           testing::AssertionResult::failure_message((AssertionResult *)0x12062e);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffff80),type,
                 (char *)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0x120682);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1206e1);
    local_c = local_c + kNonFatalFailure;
  }
  color<unsigned_char,_1U>::normalize(&local_3);
  local_4c = 0;
  while (uVar5 = local_4c, uVar2 = color<unsigned_char,_1U>::comps_count(&local_3), uVar5 < uVar2) {
    puVar4 = color<unsigned_char,_1U>::operator[](&local_3,local_4c);
    color<unsigned_char,_1U>::operator[](&local_2,local_4c);
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
              (in_stack_ffffffffffffff68,(char *)CONCAT44(uVar5,in_stack_ffffffffffffff60),puVar4,
               (uchar *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT44(uVar6,in_stack_ffffffffffffff80));
      in_stack_ffffffffffffff50 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1207bb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(uVar6,in_stack_ffffffffffffff80),type,
                 (char *)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (char *)CONCAT44(uVar5,in_stack_ffffffffffffff60));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0x120809);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x120862);
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

void test_color(ColorType input, ColorType output) {
    ColorType color;
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        color.set(i, static_cast<typename ColorType::value_type>(input[i]));
    }

    // Verify color components were set correctly
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(input[i]));
    }

    color.normalize();

    for (uint32_t  i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(output[i]));
    }
}